

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O0

void vkt::tessellation::anon_unknown_0::drawPoint
               (Surface *dst,int centerX,int centerY,RGBA *color,int size)

{
  bool bVar1;
  int b;
  int b_00;
  int pixY;
  int pixX;
  int xOff;
  int yOff;
  int height;
  int width;
  int size_local;
  RGBA *color_local;
  int centerY_local;
  int centerX_local;
  Surface *dst_local;
  
  b = tcu::Surface::getWidth(dst);
  b_00 = tcu::Surface::getHeight(dst);
  for (pixX = -((size + -1) / 2); pixX <= size / 2; pixX = pixX + 1) {
    for (pixY = -((size + -1) / 2); pixY <= size / 2; pixY = pixY + 1) {
      bVar1 = de::inBounds<int>(centerX + pixY,0,b);
      if ((bVar1) && (bVar1 = de::inBounds<int>(centerY + pixX,0,b_00), bVar1)) {
        tcu::Surface::setPixel(dst,centerX + pixY,centerY + pixX,(RGBA)color->m_value);
      }
    }
  }
  return;
}

Assistant:

void drawPoint (tcu::Surface& dst, const int centerX, const int centerY, const tcu::RGBA& color, const int size)
{
	const int width		= dst.getWidth();
	const int height	= dst.getHeight();
	DE_ASSERT(de::inBounds(centerX, 0, width) && de::inBounds(centerY, 0, height));
	DE_ASSERT(size > 0);

	for (int yOff = -((size-1)/2); yOff <= size/2; ++yOff)
	for (int xOff = -((size-1)/2); xOff <= size/2; ++xOff)
	{
		const int pixX = centerX + xOff;
		const int pixY = centerY + yOff;
		if (de::inBounds(pixX, 0, width) && de::inBounds(pixY, 0, height))
			dst.setPixel(pixX, pixY, color);
	}
}